

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_rand.c
# Opt level: O1

ares_rand_state * ares_init_rand_state(void)

{
  ares_rand_state *state;
  
  state = (ares_rand_state *)ares_malloc_zero(0x220);
  if (state == (ares_rand_state *)0x0) {
    state = (ares_rand_state *)0x0;
  }
  else {
    ares_init_rand_engine(state);
  }
  return state;
}

Assistant:

ares_rand_state *ares_init_rand_state(void)
{
  ares_rand_state *state = NULL;

  state = ares_malloc_zero(sizeof(*state));
  if (!state) {
    return NULL;
  }

  if (!ares_init_rand_engine(state)) {
    ares_free(state); /* LCOV_EXCL_LINE: UntestablePath */
    return NULL;      /* LCOV_EXCL_LINE: UntestablePath */
  }

  return state;
}